

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

void __thiscall embree::FileStream::~FileStream(FileStream *this)

{
  bool bVar1;
  Stream<int> *in_RDI;
  
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__FileStream_0061f1b8;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&in_RDI[1].super_RefCount._vptr_RefCount +
                            (long)in_RDI[1].super_RefCount._vptr_RefCount[-3]));
  if (bVar1) {
    std::ifstream::close();
  }
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x19b4a3);
  std::ifstream::~ifstream(in_RDI + 1);
  Stream<int>::~Stream(in_RDI);
  return;
}

Assistant:

~FileStream() { 
      if (ifs) ifs.close();
    }